

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O2

QString * __thiscall
QOpenGLProgramBinaryCache::cacheFileName
          (QString *__return_storage_ptr__,QOpenGLProgramBinaryCache *this,QByteArray *cacheKey)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QStringBuilder<const_QString_&,_QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QString::fromUtf8<void>((QString *)&local_68,cacheKey);
  local_48.b.d.size = local_68.size;
  local_48.b.d.ptr = local_68.ptr;
  local_48.b.d.d = local_68.d;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  local_48.a = &this->m_currentCacheDir;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>(__return_storage_ptr__,&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QOpenGLProgramBinaryCache::cacheFileName(const QByteArray &cacheKey) const
{
    return m_currentCacheDir + QString::fromUtf8(cacheKey);
}